

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sreadrb.c
# Opt level: O2

void sreadrb(int *nrow,int *ncol,int_t *nonz,float **nzval,int_t **rowind,int_t **colptr)

{
  int *piVar1;
  float fVar2;
  byte bVar3;
  char cVar4;
  float *pfVar5;
  int_t *addr;
  int_t *addr_00;
  FILE *__stream;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  int_t *addr_01;
  int_t *addr_02;
  int_t *addr_03;
  void *addr_04;
  ulong uVar11;
  int_t *piVar12;
  float *pfVar13;
  ulong uVar14;
  long lVar15;
  int_t *piVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  byte *__nptr;
  int iVar20;
  char *__s;
  bool bVar21;
  double dVar22;
  int tmp;
  float **local_210;
  int_t **local_208;
  int_t **local_200;
  long local_1f8;
  int_t *local_1f0;
  int_t *local_1e8;
  int local_1e0;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char msg [256];
  char buf [100];
  
  __stream = _stdin;
  local_210 = nzval;
  local_208 = rowind;
  local_200 = colptr;
  local_1e8 = nonz;
  fgets(buf,100,_stdin);
  fputs(buf,_stdout);
  iVar6 = 4;
  iVar18 = 0;
  while (iVar20 = iVar6 + -1, iVar6 != 0) {
    __isoc99_fscanf(__stream,"%14c",buf);
    buf[0xe] = '\0';
    __isoc99_sscanf(buf,"%d",&tmp);
    bVar21 = iVar6 == 1;
    iVar6 = iVar20;
    if (bVar21) {
      iVar18 = tmp;
    }
  }
  sDumpLine((FILE *)__stream);
  __isoc99_fscanf(__stream,"%3c",type);
  pbVar8 = (byte *)buf;
  __isoc99_fscanf(__stream,"%11c",pbVar8);
  type[3] = '\0';
  __isoc99_fscanf(__stream,"%14c",pbVar8);
  iVar6 = atoi((char *)pbVar8);
  *nrow = iVar6;
  __isoc99_fscanf(__stream,"%14c",pbVar8);
  iVar6 = atoi((char *)pbVar8);
  *ncol = iVar6;
  __isoc99_fscanf(__stream,"%14c",pbVar8);
  iVar6 = atoi((char *)pbVar8);
  piVar16 = local_1e8;
  *local_1e8 = iVar6;
  __isoc99_fscanf(__stream,"%14c",pbVar8);
  tmp = atoi((char *)pbVar8);
  if (tmp != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  sDumpLine((FILE *)__stream);
  sallocateA(*ncol,*piVar16,local_210,local_208,local_200);
  __isoc99_fscanf(__stream,"%16c",pbVar8);
  sParseIntFormat((char *)pbVar8,&colnum,&colsize);
  __isoc99_fscanf(__stream,"%16c",pbVar8);
  sParseIntFormat((char *)pbVar8,&rownum,&rowsize);
  __isoc99_fscanf(__stream,"%20c",pbVar8);
  do {
    bVar3 = *pbVar8;
    pbVar8 = pbVar8 + 1;
  } while (bVar3 != 0x28);
  iVar6 = atoi((char *)pbVar8);
  while( true ) {
    do {
      __nptr = pbVar8 + 1;
      uVar7 = *pbVar8 - 0x44;
      pbVar8 = __nptr;
    } while (0x2c < uVar7);
    if ((0x700000007U >> ((ulong)uVar7 & 0x3f) & 1) != 0) break;
    if ((0x100000001000U >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
      iVar6 = atoi((char *)__nptr);
    }
  }
  for (; (*pbVar8 != 0x29 && (*pbVar8 != 0x2e)); pbVar8 = pbVar8 + 1) {
  }
  *pbVar8 = 0;
  uVar7 = atoi((char *)__nptr);
  sDumpLine((FILE *)__stream);
  ReadVector((FILE *)__stream,*ncol + 1,*local_200,colnum,colsize);
  ReadVector((FILE *)__stream,*piVar16,*local_208,rownum,rowsize);
  if (iVar18 != 0) {
    iVar18 = *piVar16;
    pfVar5 = *local_210;
    lVar17 = 0;
    uVar19 = 0;
    if (0 < (int)uVar7) {
      uVar19 = (ulong)uVar7;
    }
    lVar9 = (long)(int)uVar7;
    while (piVar16 = local_1e8, (int)lVar17 < iVar18) {
      __s = msg;
      fgets(__s,100,__stream);
      lVar10 = 0;
      for (lVar17 = (long)(int)lVar17; (lVar10 < iVar6 && (lVar17 < iVar18)); lVar17 = lVar17 + 1) {
        lVar15 = (lVar10 + 1) * lVar9;
        cVar4 = msg[lVar15];
        msg[lVar15] = '\0';
        for (uVar14 = 0; uVar19 != uVar14; uVar14 = uVar14 + 1) {
          if ((byte)(__s[uVar14] | 0x20U) == 100) {
            __s[uVar14] = 'E';
          }
        }
        dVar22 = atof(msg + lVar10 * lVar9);
        pfVar5[lVar17] = (float)dVar22;
        msg[lVar15] = cVar4;
        __s = __s + lVar9;
        lVar10 = lVar10 + 1;
      }
    }
  }
  if ((type[1] & 0xdfU) == 0x53) {
    uVar7 = *ncol;
    addr = *local_208;
    addr_00 = *local_200;
    pfVar5 = *local_210;
    iVar18 = uVar7 + 1;
    addr_01 = intMalloc(iVar18);
    if (addr_01 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xc9,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      superlu_abort_and_exit(msg);
    }
    addr_02 = intMalloc(iVar18);
    if (addr_02 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xcb,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      superlu_abort_and_exit(msg);
    }
    addr_03 = intMalloc(*piVar16);
    if (addr_03 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xcd,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      superlu_abort_and_exit(msg);
    }
    addr_04 = superlu_malloc((long)*piVar16 << 2);
    if (addr_04 == (void *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xcf,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      superlu_abort_and_exit(msg);
    }
    uVar19 = 0;
    uVar14 = 0;
    if (0 < (int)uVar7) {
      uVar14 = (ulong)uVar7;
    }
    for (; uVar14 != uVar19; uVar19 = uVar19 + 1) {
      addr_01[uVar19] = 0;
    }
    uVar19 = 0;
    while (uVar19 != uVar14) {
      piVar1 = addr_00 + uVar19;
      uVar19 = uVar19 + 1;
      for (lVar17 = (long)*piVar1; lVar17 < addr_00[uVar19]; lVar17 = lVar17 + 1) {
        addr_01[addr[lVar17]] = addr_01[addr[lVar17]] + 1;
      }
    }
    *addr_02 = 0;
    for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
      addr_02[uVar19 + 1] = addr_01[uVar19] + addr_02[uVar19];
      addr_01[uVar19] = addr_02[uVar19];
    }
    uVar19 = 0;
    while (uVar11 = uVar19, uVar11 != uVar14) {
      for (lVar17 = (long)addr_00[uVar11]; uVar19 = uVar11 + 1, lVar17 < addr_00[uVar11 + 1];
          lVar17 = lVar17 + 1) {
        iVar6 = addr[lVar17];
        addr_03[addr_01[iVar6]] = (int_t)uVar11;
        iVar20 = addr_01[iVar6];
        *(float *)((long)addr_04 + (long)iVar20 * 4) = pfVar5[lVar17];
        addr_01[iVar6] = iVar20 + 1;
      }
    }
    lVar17 = (long)*piVar16 * 2 - (long)(int)uVar7;
    local_1f0 = intMalloc(iVar18);
    local_1f8 = lVar17;
    if (local_1f0 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xe8,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      superlu_abort_and_exit(msg);
    }
    piVar12 = intMalloc((int_t)lVar17);
    if (piVar12 == (int_t *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xea,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      superlu_abort_and_exit(msg);
    }
    pfVar13 = (float *)superlu_malloc(lVar17 * 4);
    if (pfVar13 == (float *)0x0) {
      sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xec,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadrb.c");
      superlu_abort_and_exit(msg);
    }
    *local_1f0 = 0;
    iVar18 = 0;
    uVar19 = 0;
    while (uVar19 != uVar14) {
      uVar11 = uVar19 + 1;
      for (lVar17 = (long)addr_02[uVar19]; lVar17 < addr_02[uVar11]; lVar17 = lVar17 + 1) {
        if (uVar19 != (uint)addr_03[lVar17]) {
          piVar12[iVar18] = addr_03[lVar17];
          pfVar13[iVar18] = *(float *)((long)addr_04 + lVar17 * 4);
          iVar18 = iVar18 + 1;
        }
      }
      lVar17 = (long)addr_00[uVar19];
      local_1e0 = iVar18;
      for (lVar9 = 0; lVar17 + lVar9 < (long)addr_00[uVar11]; lVar9 = lVar9 + 1) {
        piVar12[iVar18 + lVar9] = addr[lVar17 + lVar9];
        fVar2 = pfVar5[lVar17 + lVar9];
        pfVar13[iVar18 + lVar9] = fVar2;
        if (ABS(fVar2) <= 0.0 && ABS(fVar2) != 0.0) {
          printf("%5d: %e\n",(ulong)(uint)(iVar18 + (int)lVar9));
        }
      }
      iVar18 = local_1e0 + (int)lVar9;
      local_1f0[uVar11] = iVar18;
      uVar19 = uVar11;
      piVar16 = local_1e8;
      lVar17 = local_1f8;
    }
    printf("FormFullA: new_nnz = %lld\n",lVar17);
    superlu_free(pfVar5);
    superlu_free(addr);
    superlu_free(addr_00);
    superlu_free(addr_01);
    superlu_free(addr_04);
    superlu_free(addr_03);
    superlu_free(addr_02);
    *local_210 = pfVar13;
    *local_208 = piVar12;
    *local_200 = local_1f0;
    *piVar16 = (int_t)local_1f8;
  }
  fclose(__stream);
  return;
}

Assistant:

void
sreadrb(int *nrow, int *ncol, int_t *nonz,
        float **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;
    FILE *fp;

    fp = stdin;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<4; i++) {
        fscanf(fp, "%14c", buf); buf[14] = 0;
        sscanf(buf, "%d", &tmp);
        if (i == 3) numer_lines = tmp;
    }
    sDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#ifdef DEBUG
    printf("Matrix type %s\n", type);
#endif

    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);

    if (tmp != 0)
        printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
        printf("Matrix is not square.\n");
    sDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    sallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    sParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    sParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    sParseFloatFormat(buf, &valnum, &valsize);
    sDumpLine(fp);

#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif

    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        sReadValues(fp, *nonz, *nzval, valnum, valsize);
    }

    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}